

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::read_from_stream
               (image_u8 *dest,data_stream_serializer *serializer,uint read_flags)

{
  bool bVar1;
  int iVar2;
  dynamic_string ext;
  dynamic_string local_30;
  
  if ((1 < read_flags) || (serializer->m_pStream == (data_stream *)0x0)) {
    return false;
  }
  dynamic_string::dynamic_string(&local_30,&serializer->m_pStream->m_name);
  file_utils::get_extension(&local_30);
  iVar2 = dynamic_string::compare(&local_30,"jpg",false);
  if (iVar2 == 0) {
    if (read_flags != 0) goto LAB_00119f17;
  }
  else {
    iVar2 = dynamic_string::compare(&local_30,"jpeg",false);
    if (iVar2 != 0 || read_flags != 0) {
LAB_00119f17:
      bVar1 = read_from_stream_stb(serializer,dest);
      goto LAB_00119f42;
    }
  }
  bVar1 = read_from_stream_jpgd(serializer,dest);
LAB_00119f42:
  if ((local_30.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_30.m_pStr + -8) ^ *(uint *)(local_30.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_30.m_pStr + -0x10);
  }
  return bVar1;
}

Assistant:

bool read_from_stream(image_u8& dest, data_stream_serializer& serializer, uint read_flags) {
  if (read_flags > cReadFlagsAllFlags) {
    CRNLIB_ASSERT(0);
    return false;
  }

  if (!serializer.get_stream()) {
    CRNLIB_ASSERT(0);
    return false;
  }

  dynamic_string ext(serializer.get_name());
  file_utils::get_extension(ext);

  if ((ext == "jpg") || (ext == "jpeg")) {
    // Use my jpeg decoder by default because it supports progressive jpeg's.
    if ((read_flags & cReadFlagForceSTB) == 0) {
      return image_utils::read_from_stream_jpgd(serializer, dest);
    }
  }

  return image_utils::read_from_stream_stb(serializer, dest);
}